

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

bool __thiscall cmCPackDebGenerator::createDebPackages(cmCPackDebGenerator *this)

{
  bool bVar1;
  string *psVar2;
  byte local_114;
  bool local_112;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  cmValue local_78;
  cmValue dbgsymdir_path;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  byte local_19;
  anon_class_8_1_8991fb9c aStack_18;
  bool retval;
  anon_class_8_1_8991fb9c make_package;
  cmCPackDebGenerator *this_local;
  
  aStack_18.this = this;
  make_package.this = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"GEN_WDIR",&local_49);
  local_28 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_48);
  psVar2 = cmValue::operator_cast_to_string_(&local_28);
  dbgsymdir_path.Value = (string *)createDeb;
  bVar1 = createDebPackages::anon_class_8_1_8991fb9c::operator()
                    (&stack0xffffffffffffffe8,psVar2,"GEN_CPACK_OUTPUT_FILE_NAME",0x1d56b0);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_19 = bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"GEN_DBGSYMDIR",&local_99);
  local_78 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"GEN_CPACK_DEBIAN_DEBUGINFO_PACKAGE",&local_c1);
  bVar1 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_c0);
  local_112 = false;
  if (bVar1) {
    local_112 = cmValue::operator_cast_to_bool(&local_78);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  if (local_112 != false) {
    psVar2 = cmValue::operator_cast_to_string_(&local_78);
    bVar1 = createDebPackages::anon_class_8_1_8991fb9c::operator()
                      (&stack0xffffffffffffffe8,psVar2,"GEN_CPACK_DBGSYM_OUTPUT_FILE_NAME",0x1d8520)
    ;
    local_114 = 0;
    if (bVar1) {
      local_114 = local_19;
    }
    local_19 = local_114 & 1;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool cmCPackDebGenerator::createDebPackages()
{
  auto make_package = [this](const std::string& path,
                             const char* const output_var,
                             bool (cmCPackDebGenerator::*creator)()) -> bool {
    try {
      this->packageFiles = findFilesIn(path);
    } catch (const std::runtime_error& ex) {
      cmCPackLogger(cmCPackLog::LOG_ERROR, ex.what() << std::endl);
      return false;
    }

    if ((this->*creator)()) {
      // add the generated package to package file names list
      this->packageFileNames.emplace_back(
        cmStrCat(this->GetOption("CPACK_TOPLEVEL_DIRECTORY"), '/',
                 this->GetOption(output_var)));
      return true;
    }
    return false;
  };
  bool retval =
    make_package(this->GetOption("GEN_WDIR"), "GEN_CPACK_OUTPUT_FILE_NAME",
                 &cmCPackDebGenerator::createDeb);
  cmValue dbgsymdir_path = this->GetOption("GEN_DBGSYMDIR");
  if (this->IsOn("GEN_CPACK_DEBIAN_DEBUGINFO_PACKAGE") && dbgsymdir_path) {
    retval = make_package(dbgsymdir_path, "GEN_CPACK_DBGSYM_OUTPUT_FILE_NAME",
                          &cmCPackDebGenerator::createDbgsymDDeb) &&
      retval;
  }
  return static_cast<int>(retval);
}